

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * Kvm::mulProc(Kvm *vm,Value *args)

{
  long lVar1;
  
  lVar1 = 1;
  for (; args != vm->NIL; args = *(Value **)&args[1].type_) {
    lVar1 = lVar1 * ((long)args[1]._vptr_Value >> 1);
  }
  return (Value *)(lVar1 * 2 + 1);
}

Assistant:

const Value* Kvm::mulProc(Kvm *vm, const Value *args)
{
    long result = 1;
    
    while (args != vm->NIL)
    {
        result *= TK_INT(car(args));
        args = cdr(args);
    }
    
    return vm->makeFixnum(result);
}